

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O3

int cuddInitLinear(DdManager *table)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long *__s;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  iVar3 = table->size;
  uVar1 = iVar3 - 1;
  iVar5 = ((int)uVar1 >> 6) + 1;
  uVar6 = iVar5 * iVar3;
  __s = (long *)malloc((long)(int)uVar6 * 8);
  table->linear = __s;
  if (__s == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    iVar3 = 0;
  }
  else {
    table->memused = table->memused + (long)(int)uVar6 * 8;
    table->linearSize = iVar3;
    if (0 < (int)uVar6) {
      memset(__s,0,(ulong)uVar6 << 3);
    }
    if (0 < iVar3) {
      iVar2 = ((int)uVar1 >> 6) * 2 + 2;
      uVar7 = 0;
      uVar8 = 1;
      iVar4 = 0;
      uVar6 = 0;
      do {
        if ((bool)(~((int)(uVar1 ^ 0x80000000) < (int)(uVar7 ^ 0x80000000)) & 1)) {
          __s[(int)(iVar4 + (uVar6 >> 6))] = (ulong)(uint)(1 << ((byte)uVar6 & 0x1e));
        }
        if ((int)(uVar8 ^ 0x80000000) <= (int)(uVar1 ^ 0x80000000)) {
          __s[(int)((uVar6 >> 6) + iVar5)] = (long)(1 << ((byte)uVar6 + 1 & 0x1f));
        }
        uVar6 = uVar6 + 2;
        uVar7 = uVar7 + 2;
        uVar8 = uVar8 + 2;
        iVar5 = iVar5 + iVar2;
        iVar4 = iVar4 + iVar2;
      } while ((iVar3 + 1U & 0xfffffffe) != uVar6);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
cuddInitLinear(
  DdManager * table)
{
    int words;
    int wordsPerRow;
    int nvars;
    int word;
    int bit;
    int i;
    long *linear;

    nvars = table->size;
    wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    words = wordsPerRow * nvars;
    table->linear = linear = ABC_ALLOC(long,words);
    if (linear == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    table->memused += words * sizeof(long);
    table->linearSize = nvars;
    for (i = 0; i < words; i++) linear[i] = 0;
    for (i = 0; i < nvars; i++) {
        word = wordsPerRow * i + (i >> LOGBPL);
        bit  = i & (BPL-1);
        linear[word] = 1 << bit;
    }
    return(1);

}